

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_engine.h
# Opt level: O0

void __thiscall
absl::lts_20250127::random_internal::randen_engine<unsigned_long>::
reseed<absl::lts_20250127::random_internal::RandenPoolSeedSeq>
          (randen_engine<unsigned_long> *this,RandenPoolSeedSeq *seq)

{
  ulong uVar1;
  result_type_conflict *state;
  size_t local_150;
  size_t src;
  size_t dst;
  size_t local_128;
  size_t requested_entropy;
  size_t entropy_size;
  sequence_result_type buffer [60];
  size_t kBufferSize;
  RandenPoolSeedSeq *seq_local;
  randen_engine<unsigned_long> *this_local;
  
  requested_entropy = RandenPoolSeedSeq::size(seq);
  if (requested_entropy < 0x3c) {
    local_150 = requested_entropy;
    if (requested_entropy == 0) {
      local_150 = 8;
    }
    local_128 = local_150;
    dst._4_4_ = 0;
    std::fill<unsigned_int*,int>(buffer + (local_150 - 2),buffer + 0x3a,(int *)((long)&dst + 4));
    RandenPoolSeedSeq::generate<unsigned_int*>(seq,(uint *)&entropy_size,buffer + (local_128 - 2));
    src = 0x3c;
    while (7 < src) {
      uVar1 = src - 4 >> 1;
      std::swap<unsigned_int>(buffer + (src - 7),buffer + (uVar1 - 3));
      std::swap<unsigned_int>(buffer + (src - 8),buffer + (uVar1 - 4));
      std::swap<unsigned_int>(buffer + (src - 9),buffer + (uVar1 - 5));
      std::swap<unsigned_int>(buffer + (src - 10),buffer + (uVar1 - 6));
      src = src - 8;
    }
  }
  else {
    RandenPoolSeedSeq::generate<unsigned_int*>(seq,(uint *)&entropy_size,buffer + 0x3a);
  }
  state = randen_engine<unsigned_long>::state(this);
  Randen::Absorb(&this->impl_,&entropy_size,state);
  this->next_ = 0x20;
  return;
}

Assistant:

void reseed(SeedSequence& seq) {
    using sequence_result_type = typename SeedSequence::result_type;
    static_assert(sizeof(sequence_result_type) == 4,
                  "SeedSequence::result_type must be 32-bit");
    constexpr size_t kBufferSize =
        Randen::kSeedBytes / sizeof(sequence_result_type);
    alignas(16) sequence_result_type buffer[kBufferSize];

    // Randen::Absorb XORs the seed into state, which is then mixed by a call
    // to Randen::Generate. Seeding with only the provided entropy is preferred
    // to using an arbitrary generate() call, so use [rand.req.seed_seq]
    // size as a proxy for the number of entropy units that can be generated
    // without relying on seed sequence mixing...
    const size_t entropy_size = seq.size();
    if (entropy_size < kBufferSize) {
      // ... and only request that many values, or 256-bits, when unspecified.
      const size_t requested_entropy = (entropy_size == 0) ? 8u : entropy_size;
      std::fill(buffer + requested_entropy, buffer + kBufferSize, 0);
      seq.generate(buffer, buffer + requested_entropy);
#ifdef ABSL_IS_BIG_ENDIAN
      // Randen expects the seed buffer to be in Little Endian; reverse it on
      // Big Endian platforms.
      for (sequence_result_type& e : buffer) {
        e = absl::little_endian::FromHost(e);
      }
#endif
      // The Randen paper suggests preferentially initializing even-numbered
      // 128-bit vectors of the randen state (there are 16 such vectors).
      // The seed data is merged into the state offset by 128-bits, which
      // implies preferring seed bytes [16..31, ..., 208..223]. Since the
      // buffer is 32-bit values, we swap the corresponding buffer positions in
      // 128-bit chunks.
      size_t dst = kBufferSize;
      while (dst > 7) {
        // leave the odd bucket as-is.
        dst -= 4;
        size_t src = dst >> 1;
        // swap 128-bits into the even bucket
        std::swap(buffer[--dst], buffer[--src]);
        std::swap(buffer[--dst], buffer[--src]);
        std::swap(buffer[--dst], buffer[--src]);
        std::swap(buffer[--dst], buffer[--src]);
      }
    } else {
      seq.generate(buffer, buffer + kBufferSize);
    }
    impl_.Absorb(buffer, state());

    // Generate will be called when operator() is called
    next_ = kStateSizeT;
  }